

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcBuildingElement>
                 (DB *db,LIST *params,IfcBuildingElement *in)

{
  size_t sVar1;
  TypeError *this;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcBuildingElement *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcBuildingElement *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcElement>(db,params,&in->super_IfcElement);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (sVar1 < 8) {
    this = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"expected 8 arguments to IfcBuildingElement",&local_49);
    TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
    __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
  }
  return local_28;
}

Assistant:

size_t GenericFill<IfcBuildingElement>(const DB& db, const LIST& params, IfcBuildingElement* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcElement*>(in));
	if (params.GetSize() < 8) { throw STEP::TypeError("expected 8 arguments to IfcBuildingElement"); }	return base;
}